

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void read_tri_vlist(char *filename,vertex_list_t *vlist)

{
  char cVar1;
  istream *piVar2;
  ostream *poVar3;
  runtime_error *this;
  uint i;
  ulong uVar4;
  uint num_v;
  uint num_t;
  string local_3e0 [32];
  fstream tri_file;
  stringstream ss;
  ostream local_1a0 [376];
  
  std::fstream::fstream(&tri_file,filename,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    piVar2 = std::istream::_M_extract<unsigned_int>((uint *)&tri_file);
    std::istream::_M_extract<unsigned_int>((uint *)piVar2);
    std::
    vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
    ::resize(vlist,(ulong)num_v);
    for (uVar4 = 0; uVar4 < num_v; uVar4 = uVar4 + 1) {
      piVar2 = std::istream::_M_extract<double>((double *)&tri_file);
      piVar2 = std::istream::_M_extract<double>((double *)piVar2);
      std::istream::_M_extract<double>((double *)piVar2);
    }
    std::fstream::close();
    std::fstream::~fstream(&tri_file);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar3 = std::operator<<(local_1a0,"Failed to ensure condition ");
  poVar3 = std::operator<<(poVar3,"tri_file.is_open()");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"at (");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/main.cpp"
                          );
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = std::operator<<(poVar3,"read_tri_vlist");
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x6c);
  poVar3 = std::operator<<(poVar3,") \n ");
  poVar3 = std::operator<<(poVar3,"Message : ");
  poVar3 = std::operator<<(poVar3,"\"unable to open tri file\"");
  std::operator<<(poVar3,"\n");
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_3e0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void read_tri_vlist( const char *filename,tri_cc_geom_t::vertex_list_t &vlist)
{
  uint num_v,num_t;

  std::fstream tri_file ( filename, std::fstream::in );

  ENSURE(tri_file.is_open(),"unable to open tri file");

  tri_file >> num_v >> num_t;

  vlist.resize(num_v);

  for ( uint i = 0; i < num_v; ++i )
    tri_file>>vlist[i][0]
            >>vlist[i][1]
            >>vlist[i][2];


  tri_file.close();
}